

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapKey::CopyFrom(MapKey *this,MapKey *other)

{
  CppType type;
  LogMessage *other_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  LogFinisher local_5d [13];
  LogMessage local_50;
  MapKey *local_18;
  MapKey *other_local;
  MapKey *this_local;
  
  local_18 = other;
  other_local = this;
  type = MapKey::type(other);
  SetType(this,type);
  switch(this->type_) {
  case CPPTYPE_INT32:
    (this->val_).int32_value_ = (local_18->val_).int32_value_;
    break;
  case CPPTYPE_INT64:
    (this->val_).int64_value_ = (local_18->val_).int64_value_;
    break;
  case CPPTYPE_UINT32:
    (this->val_).int32_value_ = (local_18->val_).int32_value_;
    break;
  case CPPTYPE_UINT64:
    (this->val_).int64_value_ = (local_18->val_).int64_value_;
    break;
  case CPPTYPE_DOUBLE:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0xd5);
    other_00 = internal::LogMessage::operator<<(&local_50,"Unsupported");
    internal::LogFinisher::operator=(local_5d,other_00);
    internal::LogMessage::~LogMessage(&local_50);
    break;
  case CPPTYPE_BOOL:
    (this->val_).bool_value_ = (bool)((local_18->val_).bool_value_ & 1);
    break;
  case CPPTYPE_STRING:
    pbVar1 = internal::
             ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_18);
    this_00 = internal::
              ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::get_mutable((ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)this);
    std::__cxx11::string::operator=((string *)this_00,(string *)pbVar1);
  }
  return;
}

Assistant:

void CopyFrom(const MapKey& other) {
    SetType(other.type());
    switch (type_) {
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        break;
      case FieldDescriptor::CPPTYPE_STRING:
        *val_.string_value_.get_mutable() = other.val_.string_value_.get();
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        val_.int64_value_ = other.val_.int64_value_;
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        val_.int32_value_ = other.val_.int32_value_;
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        val_.uint64_value_ = other.val_.uint64_value_;
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        val_.uint32_value_ = other.val_.uint32_value_;
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        val_.bool_value_ = other.val_.bool_value_;
        break;
    }
  }